

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O1

void tree_append(tree *t,char *name,size_t name_length)

{
  archive_string *as;
  size_t sVar1;
  
  as = &t->path;
  (t->path).s[t->dirname_length] = '\0';
  sVar1 = t->dirname_length;
  (t->path).length = sVar1;
  if (1 < name_length) {
    do {
      if (name[name_length - 1] != '/') goto LAB_003f6883;
      name_length = name_length - 1;
    } while (1 < name_length);
    name_length = 1;
  }
LAB_003f6883:
  archive_string_ensure(as,sVar1 + name_length + 2);
  if ((t->dirname_length != 0) && ((t->path).s[(t->path).length - 1] != '/')) {
    archive_strappend_char(as,'/');
  }
  t->basename = (t->path).s + (t->path).length;
  archive_strncat(as,name,name_length);
  (t->restore_time).name = t->basename;
  return;
}

Assistant:

static void
tree_append(struct tree *t, const char *name, size_t name_length)
{
	size_t size_needed;

	t->path.s[t->dirname_length] = '\0';
	t->path.length = t->dirname_length;
	/* Strip trailing '/' from name, unless entire name is "/". */
	while (name_length > 1 && name[name_length - 1] == '/')
		name_length--;

	/* Resize pathname buffer as needed. */
	size_needed = name_length + t->dirname_length + 2;
	archive_string_ensure(&t->path, size_needed);
	/* Add a separating '/' if it's needed. */
	if (t->dirname_length > 0 && t->path.s[archive_strlen(&t->path)-1] != '/')
		archive_strappend_char(&t->path, '/');
	t->basename = t->path.s + archive_strlen(&t->path);
	archive_strncat(&t->path, name, name_length);
	t->restore_time.name = t->basename;
}